

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<char,fmt::v10::appender,long_double>
                   (appender out,longdouble value,format_specs<char> specs,locale_ref loc)

{
  locale_ref loc_00;
  string_view bytes;
  appender out_00;
  appender out_01;
  format_specs<char> specs_00;
  bool bVar1;
  char cVar2;
  type s;
  int iVar3;
  float_specs fVar4;
  appender *paVar5;
  char *s_00;
  size_t count;
  undefined8 in_RDX;
  long in_RSI;
  buffer<char> *in_RDI;
  allocator<char> *this;
  unkbyte10 in_ST0;
  longdouble in_stack_00000008;
  big_decimal_fp f;
  int exp;
  int precision;
  memory_buffer buffer;
  appender it;
  float_specs fspecs;
  allocator<char> *alloc;
  undefined2 in_stack_fffffffffffffc50;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffc52;
  format_specs<char> *in_stack_fffffffffffffc58;
  format_specs<char> *in_stack_fffffffffffffc60;
  buffer<char> *this_00;
  undefined2 in_stack_fffffffffffffc68;
  undefined6 in_stack_fffffffffffffc6a;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 uVar7;
  undefined6 in_stack_fffffffffffffc78;
  undefined6 uVar8;
  undefined2 in_stack_fffffffffffffc7e;
  int local_37c;
  undefined6 in_stack_fffffffffffffca8;
  undefined2 in_stack_fffffffffffffcae;
  undefined8 in_stack_fffffffffffffcb0;
  undefined1 isnan;
  double __x;
  undefined8 in_stack_fffffffffffffcc0;
  undefined5 uVar9;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffcc8;
  int local_308;
  basic_string_view<char> local_300;
  buffer<char> *local_2f0;
  ulong local_2e8;
  char local_2dd;
  allocator<char> local_2c9;
  allocator<char> local_2c8 [8];
  buffer<char> *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  longdouble in_stack_fffffffffffffd50;
  float_specs in_stack_fffffffffffffd6c;
  buffer<char> *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd9c;
  longdouble in_stack_fffffffffffffda0;
  float_specs in_stack_fffffffffffffdb0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_98;
  char local_89;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_88;
  long local_80;
  undefined8 local_78;
  buffer<char> *local_70;
  undefined8 local_60;
  longdouble local_58;
  undefined8 local_38;
  undefined8 local_30;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_28;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_20;
  longdouble local_18;
  
  isnan = (undefined1)((ulong)in_stack_fffffffffffffcb0 >> 0x38);
  local_58 = in_stack_00000008;
  local_38 = in_RSI;
  local_30 = in_RDX;
  local_28.container = in_RDI;
  fVar4 = parse_float_type_spec<fmt::v10::detail::error_handler,char>
                    (in_stack_fffffffffffffc58,
                     (error_handler *)CONCAT62(in_stack_fffffffffffffc52,in_stack_fffffffffffffc50))
  ;
  local_60._6_2_ = fVar4._6_2_;
  local_60._0_5_ = fVar4._0_5_;
  local_60 = CONCAT26(local_60._6_2_,CONCAT15(local_30._1_1_ >> 4,(undefined5)local_60)) &
             0xffff07ffffffffff;
  local_18 = local_58;
  __x = (double)local_58;
  bVar1 = std::signbit(__x);
  if (bVar1) {
    local_60._0_6_ = CONCAT15(1,(undefined5)local_60);
    local_58 = -local_58;
  }
  else if ((local_60._4_4_ >> 8 & 0xff) == 1) {
    local_60 = local_60 & 0xffff00ffffffffff;
  }
  alloc = SUB108(local_58,0);
  uVar6 = (undefined2)((unkuint10)local_58 >> 0x40);
  bVar1 = isfinite<long_double,_0>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60));
  if (bVar1) {
    if ((((byte)((ulong)local_30 >> 8) & 0xf) == 4) && ((char)(local_60 >> 0x28) != '\0')) {
      paVar5 = reserve<fmt::v10::appender>((appender *)&local_28,1);
      local_88.container =
           (paVar5->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_89 = sign<char,fmt::v10::sign::type>((type)(local_60 >> 0x28));
      local_98.container = (buffer<char> *)appender::operator++((appender *)&local_88,0);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_98);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                 CONCAT62(in_stack_fffffffffffffc52,uVar6),(value_type *)alloc);
      local_28.container =
           (buffer<char> *)base_iterator<fmt::v10::appender>(local_28.container,local_88.container);
      local_60 = local_60 & 0xffff00ffffffffff;
      if ((int)local_38 != 0) {
        local_38 = CONCAT44(local_38._4_4_,(int)local_38 + -1);
      }
    }
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT62(in_stack_fffffffffffffc52,uVar6),alloc);
    this = &local_2c9;
    std::allocator<char>::~allocator(this);
    cVar2 = (char)(local_60 >> 0x20);
    if (cVar2 == '\x03') {
      s = (type)(local_60 >> 0x28);
      if (s != none) {
        local_2dd = sign<char,fmt::v10::sign::type>(s);
        this = local_2c8;
        buffer<char>::push_back
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffc52,uVar6),(char *)alloc);
      }
      convert_float<long_double>((convert_float_result<long_double> *)this,local_58);
      local_2e8 = local_60;
      uVar6 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      format_hexfloat<long_double,_0>
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffd90);
      local_2f0 = local_28.container;
      s_00 = buffer<char>::data((buffer<char> *)local_2c8);
      count = buffer<char>::size((buffer<char> *)local_2c8);
      basic_string_view<char>::basic_string_view(&local_300,s_00,count);
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._6_2_ =
           in_stack_fffffffffffffc7e;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_6_ =
           in_stack_fffffffffffffc78;
      bytes.data_._2_6_ = in_stack_fffffffffffffc6a;
      bytes.data_._0_2_ = in_stack_fffffffffffffc68;
      bytes.size_._0_4_ = in_stack_fffffffffffffc70;
      bytes.size_._4_4_ = in_stack_fffffffffffffc74;
      local_20.container =
           (buffer<char> *)
           write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                     (out_00,bytes,in_stack_fffffffffffffc60);
    }
    else {
      if ((local_38 < 0) && ((char)local_30 != '\0')) {
        local_37c = 6;
      }
      else {
        local_37c = local_38._4_4_;
      }
      local_308 = local_37c;
      if (cVar2 == '\x01') {
        iVar3 = max_value<int>();
        if (local_37c == iVar3) {
          throw_format_error((char *)in_stack_fffffffffffffc60);
        }
        local_308 = local_37c + 1;
      }
      else if ((cVar2 != '\x02') && (local_37c == 0)) {
        local_308 = 1;
      }
      convert_float<long_double>((convert_float_result<long_double> *)this,local_58);
      uVar7 = (undefined4)in_ST0;
      uVar8 = (undefined6)((unkuint10)in_ST0 >> 0x20);
      uVar6 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      iVar3 = format_float<long_double>
                        (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                         in_stack_fffffffffffffd6c,in_stack_fffffffffffffd40);
      local_60 = CONCAT44(local_60._4_4_,local_308);
      this_00 = (buffer<char> *)local_2c8;
      buffer<char>::data(this_00);
      buffer<char>::size(this_00);
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._6_2_ =
           in_stack_fffffffffffffc7e;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_6_ = uVar8;
      fVar4._4_4_ = uVar7;
      fVar4.precision = iVar3;
      loc_00.locale_._2_6_ = in_stack_fffffffffffffc6a;
      loc_00.locale_._0_2_ = in_stack_fffffffffffffc68;
      local_20.container =
           (buffer<char> *)
           write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                     (out_01,this_00,in_stack_fffffffffffffc58,fVar4,loc_00);
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT62(in_stack_fffffffffffffc52,uVar6));
  }
  else {
    local_70 = local_28.container;
    isnan<long_double>(local_58);
    local_80 = local_38;
    local_78 = local_30;
    uVar9 = (undefined5)((ulong)in_stack_fffffffffffffcc0 >> 0x18);
    specs_00.type = (char)in_stack_fffffffffffffcc0;
    specs_00._9_2_ = (short)((ulong)in_stack_fffffffffffffcc0 >> 8);
    specs_00.fill.data_[0] = (char)uVar9;
    specs_00.fill.data_[1] = (char)((uint5)uVar9 >> 8);
    specs_00.fill.data_[2] = (char)((uint5)uVar9 >> 0x10);
    specs_00.fill.data_[3] = (char)((uint5)uVar9 >> 0x18);
    specs_00.fill.size_ = (char)((uint5)uVar9 >> 0x20);
    specs_00._0_8_ = __x;
    local_20.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (in_stack_fffffffffffffcc8.container,(bool)isnan,specs_00,
                    (float_specs *)CONCAT26(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8));
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_20.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}